

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

uint __thiscall kj::_::BTreeImpl::Leaf::size(Leaf *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint i;
  Leaf *this_local;
  
  bVar1 = MaybeUint::operator!=(this->rows + 6,(void *)0x0);
  bVar2 = MaybeUint::operator!=(this->rows + ((uint)bVar1 * 7 + 3),(void *)0x0);
  iVar3 = (uint)bVar2 * 4 + (uint)bVar1 * 7;
  bVar1 = MaybeUint::operator!=(this->rows + (iVar3 + 1),(void *)0x0);
  uVar4 = (uint)bVar1 * 2 + iVar3;
  bVar1 = MaybeUint::operator!=(this->rows + uVar4,(void *)0x0);
  return bVar1 + uVar4;
}

Assistant:

inline uint size() const {
    static_assert(Leaf::NROWS == 14, "logic here needs updating");

    // Binary search for first empty element in `rows`, or return 14 if no empty elements. We do
    // this in a branch-free manner. Since there are 15 possible results (0 through 14, inclusive),
    // this isn't a perfectly balanced binary search. We carefully choose the split points so that
    // there's no way we'll try to dereference row[14] or later (which would be a buffer overflow).
    uint i = (rows[6] != nullptr) * 7;
    i += (rows[i + 3] != nullptr) * 4;
    i += (rows[i + 1] != nullptr) * 2;
    i += (rows[i    ] != nullptr);
    return i;
  }